

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native_object.cpp
# Opt level: O2

bool __thiscall
mjs::native_object::do_redefine_own_property
          (native_object *this,string *name,value *val,property_attribute attr)

{
  bool bVar1;
  native_object_property *pnVar2;
  wstring_view local_38;
  
  local_38 = string::view(name);
  pnVar2 = find(this,&local_38);
  if (pnVar2 == (native_object_property *)0x0) {
    bVar1 = object::do_redefine_own_property(&this->super_object,name,val,attr);
    return bVar1;
  }
  bVar1 = do_native_put(this,name,val);
  if (bVar1) {
    pnVar2->attributes = attr;
  }
  return bVar1;
}

Assistant:

bool native_object::do_redefine_own_property(const string& name, const value& val, property_attribute attr) {
    if (auto it = find(name.view())) {
        if (do_native_put(name, val)) {
            it->attributes = attr;
            return true;
        }
        return false;
    }
    return object::do_redefine_own_property(name, val, attr);
}